

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

result __thiscall
fmt::v6::internal::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  
  if (this->fixed != true) {
    return more;
  }
  iVar4 = this->exp10 + *exp;
  iVar1 = this->precision;
  iVar5 = iVar4 + this->precision;
  this->precision = iVar5;
  if (iVar5 != 0 && SCARRY4(iVar4,iVar1) == iVar5 < 0) {
    return more;
  }
  if (iVar5 < 0) {
    return done;
  }
  if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
    if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
      cVar3 = '0';
      bVar2 = true;
      goto LAB_00173363;
    }
    cVar3 = '1';
  }
  else {
    cVar3 = '0';
  }
  bVar2 = false;
LAB_00173363:
  if (bVar2) {
    return error;
  }
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = cVar3;
  return done;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }